

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModel.cpp
# Opt level: O3

int __thiscall chrono::collision::ChCollisionModel::GetFamily(ChCollisionModel *this)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = 0;
  if (((int)this->family_group & 1U) == 0) {
    uVar2 = 1;
    iVar1 = 0;
    do {
      uVar2 = uVar2 * 2;
      iVar1 = iVar1 + 1;
    } while ((uVar2 & (int)this->family_group) == 0);
  }
  return iVar1;
}

Assistant:

int ChCollisionModel::GetFamily() {
    unsigned i = 1;
    int pos = 1;
    while (!(i & family_group)) {
        i = i << 1;
        pos++;
    }
    return pos - 1;
}